

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadEffect(ColladaParser *this,Effect *pEffect)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  allocator<char> local_39;
  string local_38;
  Effect *local_18;
  Effect *pEffect_local;
  ColladaParser *this_local;
  
  local_18 = pEffect;
  pEffect_local = (Effect *)this;
  do {
    while( true ) {
      uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) {
        return;
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 != 1) break;
      bVar1 = IsElement(this,"profile_COMMON");
      if (bVar1) {
        ReadEffectProfileCommon(this,local_18);
      }
      else {
        SkipElement(this);
      }
    }
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar3 != 2);
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"effect");
  if (iVar3 == 0) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Expected end of <effect> element.",&local_39);
  ThrowException(this,&local_38);
}

Assistant:

void ColladaParser::ReadEffect(Collada::Effect& pEffect)
{
    // for the moment we don't support any other type of effect.
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("profile_COMMON"))
                ReadEffectProfileCommon(pEffect);
            else
                SkipElement();
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "effect") != 0)
                ThrowException("Expected end of <effect> element.");

            break;
        }
    }
}